

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O3

bool leveldb::GetInternalKey(Slice *input,InternalKey *dst)

{
  bool bVar1;
  long in_FS_OFFSET;
  Slice str;
  Slice local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.data_ = "";
  local_20.size_ = 0;
  bVar1 = GetLengthPrefixedSlice(input,&local_20);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&dst->rep_,0,(dst->rep_)._M_string_length,local_20.data_,local_20.size_);
    bVar1 = (dst->rep_)._M_string_length != 0;
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool GetInternalKey(Slice* input, InternalKey* dst) {
  Slice str;
  if (GetLengthPrefixedSlice(input, &str)) {
    return dst->DecodeFrom(str);
  } else {
    return false;
  }
}